

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Cluster::Finalize(Cluster *this,bool set_last_frame_duration,uint64_t duration)

{
  IMkvWriter *writer;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int32 iVar5;
  pointer ppVar6;
  reference ppFVar7;
  _Self *p_Var8;
  uint64_t uVar9;
  mapped_type *pmVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  undefined4 extraout_var;
  uint64_t uVar13;
  byte local_99;
  int64_t pos;
  uint64_t local_78;
  uint64_t local_70;
  byte local_61;
  uint64_t uStack_60;
  bool wrote_frame;
  uint64_t local_58;
  _Self local_50;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
  local_48;
  _Self local_40;
  FrameMapIterator frames_iterator;
  Frame *local_30;
  Frame *frame;
  uint64_t duration_local;
  bool set_last_frame_duration_local;
  Cluster *this_local;
  
  if ((this->writer_ == (IMkvWriter *)0x0) || ((this->finalized_ & 1U) != 0)) {
    this_local._7_1_ = false;
  }
  else if ((this->write_last_frame_with_duration_ & 1U) == 0) {
LAB_00140d91:
    if (this->size_position_ == -1) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = (*this->writer_->_vptr_IMkvWriter[3])();
      if ((uVar2 & 1) != 0) {
        iVar3 = (*this->writer_->_vptr_IMkvWriter[1])();
        iVar4 = (*this->writer_->_vptr_IMkvWriter[2])(this->writer_,this->size_position_);
        if (iVar4 != 0) {
          return false;
        }
        writer = this->writer_;
        uVar13 = payload_size(this);
        iVar5 = WriteUIntSize(writer,uVar13,8);
        if (iVar5 != 0) {
          return false;
        }
        iVar3 = (*this->writer_->_vptr_IMkvWriter[2])(this->writer_,CONCAT44(extraout_var,iVar3));
        if (iVar3 != 0) {
          return false;
        }
      }
      this->finalized_ = true;
      this_local._7_1_ = true;
    }
  }
  else {
    do {
      bVar1 = std::
              map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
              ::empty(&this->stored_frames_);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00140d91;
      frames_iterator._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
           ::begin(&this->stored_frames_);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
               ::operator->(&frames_iterator);
      ppFVar7 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::front
                          (&ppVar6->second);
      local_30 = *ppFVar7;
      local_48._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
           ::begin(&this->stored_frames_);
      p_Var8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
               ::operator++(&local_48);
      local_40._M_node = p_Var8->_M_node;
      while( true ) {
        local_50._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
             ::end(&this->stored_frames_);
        bVar1 = std::operator!=(&local_40,&local_50);
        if (!bVar1) break;
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                 ::operator->(&local_40);
        ppFVar7 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::front
                            (&ppVar6->second);
        uVar13 = Frame::timestamp(*ppFVar7);
        uVar9 = Frame::timestamp(local_30);
        if (uVar13 < uVar9) {
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                   ::operator->(&local_40);
          ppFVar7 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::front
                              (&ppVar6->second);
          local_30 = *ppFVar7;
        }
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
        ::operator++(&local_40);
      }
      local_99 = 0;
      if (set_last_frame_duration) {
        local_58 = Frame::track_number(local_30);
        pmVar10 = std::
                  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                  ::operator[](&this->stored_frames_,&local_58);
        sVar11 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::size
                           (pmVar10);
        local_99 = 0;
        if (sVar11 == 1) {
          bVar1 = Frame::duration_set(local_30);
          local_99 = bVar1 ^ 0xff;
        }
      }
      if ((local_99 & 1) != 0) {
        uVar13 = Frame::timestamp(local_30);
        Frame::set_duration(local_30,duration - uVar13);
        bVar1 = Frame::is_key(local_30);
        if ((!bVar1) && (bVar1 = Frame::reference_block_timestamp_set(local_30), !bVar1)) {
          uStack_60 = Frame::track_number(local_30);
          pmVar12 = std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::operator[](&this->last_block_timestamp_,&stack0xffffffffffffffa0);
          Frame::set_reference_block_timestamp(local_30,*pmVar12);
        }
      }
      local_61 = DoWriteFrame(this,local_30);
      local_70 = Frame::track_number(local_30);
      pmVar10 = std::
                map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                ::operator[](&this->stored_frames_,&local_70);
      std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::pop_front(pmVar10);
      local_78 = Frame::track_number(local_30);
      pmVar10 = std::
                map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                ::operator[](&this->stored_frames_,&local_78);
      bVar1 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::empty
                        (pmVar10);
      if (bVar1) {
        pos = Frame::track_number(local_30);
        std::
        map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
        ::erase(&this->stored_frames_,(key_type *)&pos);
      }
      if (local_30 != (Frame *)0x0) {
        Frame::~Frame(local_30);
        operator_delete(local_30);
      }
    } while ((local_61 & 1) != 0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Cluster::Finalize(bool set_last_frame_duration, uint64_t duration) {
  if (!writer_ || finalized_)
    return false;

  if (write_last_frame_with_duration_) {
    // Write out held back Frames. This essentially performs a k-way merge
    // across all tracks in the increasing order of timestamps.
    while (!stored_frames_.empty()) {
      Frame* frame = stored_frames_.begin()->second.front();

      // Get the next frame to write (frame with least timestamp across all
      // tracks).
      for (FrameMapIterator frames_iterator = ++stored_frames_.begin();
           frames_iterator != stored_frames_.end(); ++frames_iterator) {
        if (frames_iterator->second.front()->timestamp() < frame->timestamp()) {
          frame = frames_iterator->second.front();
        }
      }

      // Set the duration if it's the last frame for the track.
      if (set_last_frame_duration &&
          stored_frames_[frame->track_number()].size() == 1 &&
          !frame->duration_set()) {
        frame->set_duration(duration - frame->timestamp());
        if (!frame->is_key() && !frame->reference_block_timestamp_set()) {
          frame->set_reference_block_timestamp(
              last_block_timestamp_[frame->track_number()]);
        }
      }

      // Write the frame and remove it from |stored_frames_|.
      const bool wrote_frame = DoWriteFrame(frame);
      stored_frames_[frame->track_number()].pop_front();
      if (stored_frames_[frame->track_number()].empty()) {
        stored_frames_.erase(frame->track_number());
      }
      delete frame;
      if (!wrote_frame)
        return false;
    }
  }

  if (size_position_ == -1)
    return false;

  if (writer_->Seekable()) {
    const int64_t pos = writer_->Position();

    if (writer_->Position(size_position_))
      return false;

    if (WriteUIntSize(writer_, payload_size(), 8))
      return false;

    if (writer_->Position(pos))
      return false;
  }

  finalized_ = true;

  return true;
}